

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int handle_ack_frequency_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint8_t *end;
  st_quicly_application_space_t *psVar1;
  bool bVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint8_t uVar5;
  uint8_t *in_RCX;
  int iVar6;
  uint64_t unaff_R15;
  
  if ((((conn->super).ctx)->transport_params).min_ack_delay_usec == 0xffffffffffffffff) {
    iVar6 = 0x20007;
  }
  else {
    end = state->end;
    uVar3 = ptls_decode_quicint(&state->src,end);
    uVar5 = (uint8_t)in_RCX;
    iVar6 = 0x20007;
    if (uVar3 == 0xffffffffffffffff) {
      bVar2 = false;
      uVar4 = 0xffffffffffffffff;
    }
    else {
      unaff_R15 = ptls_decode_quicint(&state->src,end);
      uVar5 = (uint8_t)in_RCX;
      uVar4 = unaff_R15 + 1;
      if (uVar4 < 2) {
        bVar2 = false;
      }
      else {
        uVar4 = ptls_decode_quicint(&state->src,end);
        if ((uVar4 == 0xffffffffffffffff) || (in_RCX = state->src, in_RCX == end)) {
          uVar5 = (uint8_t)in_RCX;
          bVar2 = false;
        }
        else {
          state->src = in_RCX + 1;
          uVar5 = *in_RCX;
          bVar2 = false;
          if (uVar5 == '\x01') {
            bVar2 = true;
            iVar6 = 0;
          }
          else if (uVar5 == '\0') {
            iVar6 = 0;
            bVar2 = true;
          }
        }
      }
    }
    if ((bVar2) && (iVar6 = 0x2000a, uVar4 == 25000)) {
      iVar6 = 0;
      if ((conn->ingress).ack_frequency.next_sequence <= uVar3) {
        uVar4 = 100;
        if (unaff_R15 < 100) {
          uVar4 = unaff_R15;
        }
        (conn->ingress).ack_frequency.next_sequence = uVar3 + 1;
        psVar1 = conn->application;
        (psVar1->super).packet_tolerance = (uint32_t)uVar4;
        (psVar1->super).ignore_order = uVar5;
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

static int handle_ack_frequency_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_ack_frequency_frame_t frame;
    int ret;

    /* recognize the frame only when the support has been advertised */
    if (!recognize_delayed_ack(conn))
        return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;

    if ((ret = quicly_decode_ack_frequency_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(ACK_FREQUENCY_RECEIVE, conn, conn->stash.now, frame.sequence, frame.packet_tolerance, frame.max_ack_delay,
                 frame.ignore_order);

    /* At the moment, the only value that the remote peer would send is this value, because our TP.min_ack_delay and max_ack_delay
     * are equal. */
    if (frame.max_ack_delay != QUICLY_LOCAL_MAX_ACK_DELAY * 1000)
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;

    if (frame.sequence >= conn->ingress.ack_frequency.next_sequence) {
        conn->ingress.ack_frequency.next_sequence = frame.sequence + 1;
        conn->application->super.packet_tolerance =
            (uint32_t)(frame.packet_tolerance < QUICLY_MAX_PACKET_TOLERANCE ? frame.packet_tolerance : QUICLY_MAX_PACKET_TOLERANCE);
        conn->application->super.ignore_order = frame.ignore_order;
    }

    return 0;
}